

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O1

PriceCI * __thiscall
MonteCarloPricer::price<AsianArithmeticPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          AsianArithmeticPut *option)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar3;
  double dVar4;
  double payoff_mean;
  double payoff_std;
  double local_60;
  undefined1 local_58 [16];
  double local_40;
  double local_38;
  
  local_60 = Option::getMaturity((Option *)option);
  BlackScholesModel::generatePath(model,&local_60,this->prices_vector);
  iVar1 = this->num_sims;
  if (iVar1 < 1) {
    dVar4 = 0.0;
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    iVar2 = 0;
    dVar4 = 0.0;
    do {
      local_58._0_8_ = dVar3;
      local_40 = dVar4;
      local_60 = Option::getMaturity((Option *)option);
      BlackScholesModel::generatePath(model,&local_60,this->prices_vector);
      (*(option->super_PathDependentOption).super_Option._vptr_Option[1])
                (option,this->prices_vector);
      dVar4 = local_40 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      dVar3 = (double)local_58._0_8_ +
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      iVar2 = iVar2 + 1;
      iVar1 = this->num_sims;
    } while (iVar2 < iVar1);
  }
  local_60 = dVar4 / (double)iVar1;
  local_38 = dVar3 / (double)iVar1 - local_60 * local_60;
  dVar3 = BlackScholesModel::getRiskFreeRate(model);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = -dVar3;
  local_58._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
  dVar3 = Option::getMaturity((Option *)option);
  dVar3 = exp(dVar3 * (double)local_58._0_8_);
  local_60 = dVar3 * local_60;
  dVar3 = BlackScholesModel::getRiskFreeRate(model);
  local_58._0_8_ = dVar3 * -2.0;
  dVar3 = Option::getMaturity((Option *)option);
  dVar3 = exp(dVar3 * (double)local_58._0_8_);
  local_38 = dVar3 * local_38;
  PriceCI::PriceCI(__return_storage_ptr__,&local_60,&local_38,&this->num_sims);
  return __return_storage_ptr__;
}

Assistant:

inline PriceCI MonteCarloPricer::price(BlackScholesModel const& model, T const& option)
{
	model.generatePath(option.getMaturity(), *prices_vector);

	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		model.generatePath(option.getMaturity(), *prices_vector);
		payoff = option.payoff(*prices_vector);
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}